

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

bool testing::Test::HasSameFixtureClass(void)

{
  ostream *poVar1;
  TestInfo *pTVar2;
  TestInfo *pTVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  size_t sVar6;
  char *pcVar7;
  char *__s;
  char *pcVar8;
  Message local_40;
  AssertHelper local_38;
  
  UnitTest::GetInstance();
  pTVar2 = (UnitTest::GetInstance::instance.impl_)->current_test_info_;
  pTVar3 = *((UnitTest::GetInstance::instance.impl_)->current_test_suite_->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar4 = (undefined1 *)pTVar3->fixture_class_id_;
  puVar5 = (undefined1 *)pTVar2->fixture_class_id_;
  if (puVar5 != puVar4) {
    pcVar8 = (pTVar3->name_)._M_dataplus._M_p;
    __s = (pTVar2->name_)._M_dataplus._M_p;
    if ((puVar4 == &internal::TypeIdHelper<testing::Test>::dummy_) ||
       (puVar5 == &internal::TypeIdHelper<testing::Test>::dummy_)) {
      pcVar7 = pcVar8;
      if (puVar4 == &internal::TypeIdHelper<testing::Test>::dummy_) {
        pcVar7 = __s;
        __s = pcVar8;
      }
      Message::Message(&local_40);
      poVar1 = (ostream *)
               ((long)local_40.ss_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"All tests in the same test suite must use the same test fixture\n",0x40);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"class, so mixing TEST_F and TEST in the same test suite is\n",0x3b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"illegal.  In test suite ",0x18);
      pcVar8 = (pTVar2->test_suite_name_)._M_dataplus._M_p;
      if (pcVar8 == (char *)0x0) {
        sVar6 = 6;
        pcVar8 = "(null)";
      }
      else {
        sVar6 = strlen(pcVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar8,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,",\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"test ",5);
      if (pcVar7 == (char *)0x0) {
        sVar6 = 6;
        pcVar7 = "(null)";
      }
      else {
        sVar6 = strlen(pcVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar7,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1," is defined using TEST_F but\n",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"test ",5);
      if (__s == (char *)0x0) {
        sVar6 = 6;
        __s = "(null)";
      }
      else {
        sVar6 = strlen(__s);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1," is defined using TEST.  You probably\n",0x26);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"want to change the TEST to TEST_F or move it to another test\n",0x3d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"case.",5);
      internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/build_O1/source/tests/src/google-test-depends/googletest/src/gtest.cc"
                 ,0x9ca,"Failed");
      internal::AssertHelper::operator=(&local_38,&local_40);
    }
    else {
      Message::Message(&local_40);
      poVar1 = (ostream *)
               ((long)local_40.ss_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"All tests in the same test suite must use the same test fixture\n",0x40);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"class.  However, in test suite ",0x1f);
      pcVar7 = (pTVar2->test_suite_name_)._M_dataplus._M_p;
      if (pcVar7 == (char *)0x0) {
        sVar6 = 6;
        pcVar7 = "(null)";
      }
      else {
        sVar6 = strlen(pcVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar7,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,",\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"you defined test ",0x11);
      if (pcVar8 == (char *)0x0) {
        sVar6 = 6;
        pcVar8 = "(null)";
      }
      else {
        sVar6 = strlen(pcVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar8,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," and test ",10);
      if (__s == (char *)0x0) {
        sVar6 = 6;
        __s = "(null)";
      }
      else {
        sVar6 = strlen(__s);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"using two different test fixture classes.  This can happen if\n",0x3e);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"the two classes are from different namespaces or translation\n",0x3d);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"units and have the same name.  You should probably rename one\n",0x3e);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"of the classes to put the tests into different test suites.",0x3b);
      internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/build_O1/source/tests/src/google-test-depends/googletest/src/gtest.cc"
                 ,0x9d6,"Failed");
      internal::AssertHelper::operator=(&local_38,&local_40);
    }
    internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_40.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))
                (local_40.ss_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl);
    }
  }
  return puVar5 == puVar4;
}

Assistant:

bool Test::HasSameFixtureClass() {
  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  const TestSuite* const test_suite = impl->current_test_suite();

  // Info about the first test in the current test suite.
  const TestInfo* const first_test_info = test_suite->test_info_list()[0];
  const internal::TypeId first_fixture_id = first_test_info->fixture_class_id_;
  const char* const first_test_name = first_test_info->name();

  // Info about the current test.
  const TestInfo* const this_test_info = impl->current_test_info();
  const internal::TypeId this_fixture_id = this_test_info->fixture_class_id_;
  const char* const this_test_name = this_test_info->name();

  if (this_fixture_id != first_fixture_id) {
    // Is the first test defined using TEST?
    const bool first_is_TEST = first_fixture_id == internal::GetTestTypeId();
    // Is this test defined using TEST?
    const bool this_is_TEST = this_fixture_id == internal::GetTestTypeId();

    if (first_is_TEST || this_is_TEST) {
      // Both TEST and TEST_F appear in same test suite, which is incorrect.
      // Tell the user how to fix this.

      // Gets the name of the TEST and the name of the TEST_F.  Note
      // that first_is_TEST and this_is_TEST cannot both be true, as
      // the fixture IDs are different for the two tests.
      const char* const TEST_name =
          first_is_TEST ? first_test_name : this_test_name;
      const char* const TEST_F_name =
          first_is_TEST ? this_test_name : first_test_name;

      ADD_FAILURE()
          << "All tests in the same test suite must use the same test fixture\n"
          << "class, so mixing TEST_F and TEST in the same test suite is\n"
          << "illegal.  In test suite " << this_test_info->test_suite_name()
          << ",\n"
          << "test " << TEST_F_name << " is defined using TEST_F but\n"
          << "test " << TEST_name << " is defined using TEST.  You probably\n"
          << "want to change the TEST to TEST_F or move it to another test\n"
          << "case.";
    } else {
      // Two fixture classes with the same name appear in two different
      // namespaces, which is not allowed. Tell the user how to fix this.
      ADD_FAILURE()
          << "All tests in the same test suite must use the same test fixture\n"
          << "class.  However, in test suite "
          << this_test_info->test_suite_name() << ",\n"
          << "you defined test " << first_test_name << " and test "
          << this_test_name << "\n"
          << "using two different test fixture classes.  This can happen if\n"
          << "the two classes are from different namespaces or translation\n"
          << "units and have the same name.  You should probably rename one\n"
          << "of the classes to put the tests into different test suites.";
    }
    return false;
  }

  return true;
}